

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

Test * PlanTestPoolWithDepthOne::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1c8);
  PlanTestPoolWithDepthOne((PlanTestPoolWithDepthOne *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(PlanTest, PoolWithDepthOne) {
  TestPoolWithDepthOne(
"pool foobar\n"
"  depth = 1\n"
"rule poolcat\n"
"  command = cat $in > $out\n"
"  pool = foobar\n"
"build out1: poolcat in\n"
"build out2: poolcat in\n");
}